

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

path * __thiscall ghc::filesystem::path::replace_extension(path *this,path *replacement)

{
  size_type sVar1;
  bool bVar2;
  path *ppVar3;
  path local_40;
  
  bVar2 = has_extension(this);
  if (bVar2) {
    sVar1 = (this->_path)._M_string_length;
    extension(&local_40,this);
    std::__cxx11::string::erase((ulong)this,sVar1 - local_40._path._M_string_length);
    std::__cxx11::string::~string((string *)&local_40);
  }
  if (((replacement->_path)._M_string_length != 0) &&
     (*(replacement->_path)._M_dataplus._M_p != '.')) {
    std::__cxx11::string::push_back((char)this);
  }
  ppVar3 = concat<ghc::filesystem::path>(this,replacement);
  return ppVar3;
}

Assistant:

GHC_INLINE path& path::replace_extension(const path& replacement)
{
    if (has_extension()) {
        _path.erase(_path.size() - extension()._path.size());
    }
    if (!replacement.empty() && replacement._path[0] != '.') {
        _path += '.';
    }
    return concat(replacement);
}